

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr64.cpp
# Opt level: O3

void __thiscall
icu_63::UVector64::insertElementAt(UVector64 *this,int64_t elem,int32_t index,UErrorCode *status)

{
  int64_t *piVar1;
  UBool UVar2;
  ulong uVar3;
  uint uVar4;
  
  if ((-1 < index) && (uVar4 = this->count, index <= (int)uVar4)) {
    if (this->capacity <= (int)uVar4) {
      UVar2 = expandCapacity(this,uVar4 + 1,status);
      if (UVar2 == '\0') {
        return;
      }
      uVar4 = this->count;
    }
    piVar1 = this->elements;
    if (index < (int)uVar4) {
      uVar3 = (ulong)uVar4;
      do {
        piVar1[uVar3] = piVar1[uVar3 - 1];
        uVar3 = uVar3 - 1;
      } while ((long)(ulong)(uint)index < (long)uVar3);
    }
    piVar1[(uint)index] = elem;
    this->count = uVar4 + 1;
  }
  return;
}

Assistant:

void UVector64::insertElementAt(int64_t elem, int32_t index, UErrorCode &status) {
    // must have 0 <= index <= count
    if (0 <= index && index <= count && ensureCapacity(count + 1, status)) {
        for (int32_t i=count; i>index; --i) {
            elements[i] = elements[i-1];
        }
        elements[index] = elem;
        ++count;
    }
    /* else index out of range */
}